

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_hash.c
# Opt level: O1

uint qc_hashbin(void *key,uint uLength,uint bucket_count)

{
  int iVar1;
  uint uVar2;
  __int32_t **pp_Var3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  if (uLength == 0) {
    uVar2 = 0;
  }
  else {
    pp_Var3 = __ctype_tolower_loc();
    lVar4 = 0;
    iVar1 = 0;
    iVar6 = 0;
    iVar5 = 0;
    do {
      bVar8 = iVar6 == 5;
      iVar6 = iVar6 + 1;
      iVar7 = 0;
      if (bVar8) {
        iVar7 = iVar1;
      }
      iVar1 = iVar1 * 9;
      if (bVar8) {
        iVar1 = 0;
        iVar6 = 1;
      }
      iVar1 = iVar1 + (*pp_Var3)[*(byte *)((long)key + lVar4)];
      iVar5 = iVar5 + iVar7;
      lVar4 = lVar4 + 1;
    } while (uLength != (uint)lVar4);
    uVar2 = iVar1 + iVar5;
  }
  return uVar2 % bucket_count;
}

Assistant:

unsigned int qc_hashbin(void *key, unsigned int uLength, unsigned int bucket_count)
{
    unsigned char *psz;
    unsigned int hash_value;
    unsigned int ret;
    unsigned int i;
    unsigned int j;

    psz = (unsigned char *)key;
    hash_value = 0;

    j = 0;
    ret = 0;
    i = 0;
    while(i < uLength)
    {
	    if(j == 5)
	    {
		    j = 0;
		    ret += hash_value;
		    hash_value = 0;
	    }
	    hash_value += hash_value << 3;
	    hash_value += (unsigned int)tolower( *psz );
	    psz++;
	    j++;
	    i++;
    }

    ret += hash_value;

    return ret % bucket_count;
}